

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Entry * __thiscall
kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::insert
          (HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *this,uint key,
          Own<capnp::_::SegmentReader> *value)

{
  Entry *pEVar1;
  Entry local_20;
  
  local_20.value.disposer = value->disposer;
  local_20.value.ptr = value->ptr;
  value->ptr = (SegmentReader *)0x0;
  local_20.key = key;
  pEVar1 = Table<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Callbacks>_>
           ::insert(&this->table,&local_20);
  if (local_20.value.ptr != (SegmentReader *)0x0) {
    local_20.value.ptr = (SegmentReader *)0x0;
    (**(local_20.value.disposer)->_vptr_Disposer)();
  }
  return pEVar1;
}

Assistant:

typename HashMap<Key, Value>::Entry& HashMap<Key, Value>::insert(Key key, Value value) {
  return table.insert(Entry { kj::mv(key), kj::mv(value) });
}